

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O1

bool __thiscall deqp::egl::ConfigFilter::isMatch(ConfigFilter *this,SurfaceConfig *config)

{
  uint uVar1;
  deUint32 attribute;
  int iVar2;
  bool bVar3;
  uint uVar4;
  _Base_ptr p_Var5;
  TestError *this_00;
  _Rb_tree_header *p_Var6;
  _Self __tmp;
  bool bVar7;
  
  p_Var5 = (this->m_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_rules)._M_t._M_impl.super__Rb_tree_header;
  bVar7 = (_Rb_tree_header *)p_Var5 == p_Var6;
  if (!bVar7) {
    do {
      uVar1 = *(uint *)&p_Var5[1]._M_parent;
      bVar3 = false;
      if ((uVar1 != 0xffffffff) &&
         (attribute = *(deUint32 *)&p_Var5[1].field_0x4, 2 < attribute - 0x3035)) {
        if (attribute == 0x3041) {
          bVar3 = false;
          if (uVar1 != 0x3038) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"rule.value == EGL_NONE",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                       ,400);
LAB_00e97f38:
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
        }
        else {
          iVar2 = *(int *)((long)&p_Var5[1]._M_parent + 4);
          uVar4 = eglu::ConfigInfo::getAttribute(&config->m_info,attribute);
          if (iVar2 == 0) {
            bVar3 = true;
            if ((int)uVar1 <= (int)uVar4) {
LAB_00e97e9e:
              bVar3 = false;
            }
          }
          else if (iVar2 == 2) {
            bVar3 = true;
            if ((uVar1 & ~uVar4) == 0) goto LAB_00e97e9e;
          }
          else {
            if (iVar2 != 1) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Unknown criteria",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                         ,0x1a9);
              goto LAB_00e97f38;
            }
            bVar3 = true;
            if (uVar1 == uVar4) goto LAB_00e97e9e;
          }
        }
      }
      if (bVar3) {
        return bVar7;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      bVar7 = (_Rb_tree_header *)p_Var5 == p_Var6;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool isMatch (const SurfaceConfig& config) const
	{
		for (std::map<EGLenum, AttribRule>::const_iterator iter = m_rules.begin(); iter != m_rules.end(); iter++)
		{
			const AttribRule rule = iter->second;

			if (rule.value == EGL_DONT_CARE)
				continue;
			else if (rule.name == EGL_MATCH_NATIVE_PIXMAP)
				TCU_CHECK(rule.value == EGL_NONE); // Not supported
			else if (rule.name == EGL_TRANSPARENT_RED_VALUE || rule.name == EGL_TRANSPARENT_GREEN_VALUE || rule.name == EGL_TRANSPARENT_BLUE_VALUE)
				continue;
			else
			{
				const EGLint cfgValue = config.getAttribute(rule.name);

				switch (rule.criteria)
				{
					case CRITERIA_EXACT:
						if (rule.value != cfgValue)
							return false;
						break;

					case CRITERIA_AT_LEAST:
						if (rule.value > cfgValue)
							return false;
						break;

					case CRITERIA_MASK:
						if ((rule.value & cfgValue) != rule.value)
							return false;
						break;

					default:
						TCU_FAIL("Unknown criteria");
				}
			}
		}

		return true;
	}